

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O1

void __thiscall
gimage::BasicImageIO::load
          (BasicImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  IOException *this_00;
  long *plVar1;
  undefined4 in_register_0000000c;
  long *plVar2;
  size_type *psVar3;
  allocator local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  string local_48 [32];
  
  this_00 = (IOException *)
            __cxa_allocate_exception(0x28,image,name,CONCAT44(in_register_0000000c,ds));
  std::__cxx11::string::string(local_48,name,&local_89);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x12f09d);
  local_88 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_88 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_68._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68.field_2._8_8_ = plVar1[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar3;
  }
  local_68._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_68);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void BasicImageIO::load(ImageU8 &image, const char *name, int ds, long x,
                        long y, long w, long h) const
{
  throw gutil::IOException("Loading this image type is not implemented! ("+std::string(name)+")");
}